

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rand_gen.c
# Opt level: O0

param_1 * parse_param_1(char *type)

{
  param_1 *ppVar1;
  char *__nptr;
  double local_28;
  param_1 *res;
  char *tok;
  char *type_local;
  
  ppVar1 = (param_1 *)malloc(8);
  if (ppVar1 != (param_1 *)0x0) {
    strtok(type,":");
    __nptr = strtok((char *)0x0,":");
    if (__nptr == (char *)0x0) {
      local_28 = 0.0;
    }
    else {
      local_28 = atof(__nptr);
    }
    ppVar1->a = local_28;
    return ppVar1;
  }
  __assert_fail("res",
                "/workspace/llm4binary/github/license_c_cmakelists/epfl-dcsl[P]lancet-tool/agents/rand_gen.c"
                ,0x120,"struct param_1 *parse_param_1(char *)");
}

Assistant:

static struct param_1 *parse_param_1(char *type)
{
	char *tok;
	struct param_1 *res;

	res = (struct param_1 *)malloc(sizeof(struct param_1));
	assert(res);

	tok = strtok(type, ":");
	tok = strtok(NULL, ":");
	res->a = (tok == NULL) ? 0 : atof(tok);

	return res;
}